

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::findNextFCDBoundary(Normalizer2Impl *this,UChar *p,UChar *limit)

{
  uint16_t norm16_00;
  UChar *pUVar1;
  UBool UVar2;
  UChar *pUVar3;
  int local_4c;
  int local_3c;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *codePointStart;
  UChar *limit_local;
  UChar *p_local;
  Normalizer2Impl *this_local;
  
  limit_local = p;
  while( true ) {
    pUVar1 = limit_local;
    if (limit <= limit_local) {
      return limit_local;
    }
    pUVar3 = limit_local + 1;
    __index = (int32_t)(ushort)*limit_local;
    if ((__index & 0xfffff800U) == 0xd800) {
      if ((((*limit_local & 0x400U) == 0) && (pUVar3 != limit)) && ((*pUVar3 & 0xfc00U) == 0xdc00))
      {
        __index = __index * 0x400 + (uint)(ushort)*pUVar3 + -0x35fdc00;
        if (__index < this->normTrie->highStart) {
          local_4c = ucptrie_internalSmallIndex_63(this->normTrie,__index);
        }
        else {
          local_4c = this->normTrie->dataLength + -2;
        }
        local_3c = local_4c;
        limit_local = limit_local + 2;
      }
      else {
        local_3c = this->normTrie->dataLength + -1;
        limit_local = pUVar3;
      }
    }
    else {
      local_3c = (uint)this->normTrie->index[__index >> 6] + (__index & 0x3fU);
      limit_local = pUVar3;
    }
    norm16_00 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_3c * 2);
    if ((__index < (int)(uint)(ushort)this->minLcccCP) ||
       (UVar2 = norm16HasDecompBoundaryBefore(this,norm16_00), UVar2 != '\0')) break;
    UVar2 = norm16HasDecompBoundaryAfter(this,norm16_00);
    if (UVar2 != '\0') {
      return limit_local;
    }
  }
  return pUVar1;
}

Assistant:

const UChar *Normalizer2Impl::findNextFCDBoundary(const UChar *p, const UChar *limit) const {
    while(p<limit) {
        const UChar *codePointStart=p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if (c < minLcccCP || norm16HasDecompBoundaryBefore(norm16)) {
            return codePointStart;
        }
        if (norm16HasDecompBoundaryAfter(norm16)) {
            return p;
        }
    }
    return p;
}